

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Hint.c
# Opt level: O3

int Llb_ManMaxFanoutCi(Aig_Man_t *pAig)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar2 = (ulong)pAig->vCis->nSize;
  if (0 < (long)uVar2) {
    uVar1 = 0xffffffff;
    uVar5 = 0;
    uVar3 = 0xc4653600;
    do {
      uVar6 = *(uint *)((long)pAig->vCis->pArray[uVar5] + 0x18) >> 6;
      uVar4 = uVar3;
      if ((int)uVar3 <= (int)uVar6) {
        uVar4 = uVar6;
      }
      if ((int)uVar3 < (int)uVar6) {
        uVar1 = uVar5 & 0xffffffff;
      }
      uVar5 = uVar5 + 1;
      uVar3 = uVar4;
    } while (uVar2 != uVar5);
    if (-1 < (int)uVar1) {
      return (int)uVar1;
    }
  }
  __assert_fail("iInput >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Hint.c"
                ,0x37,"int Llb_ManMaxFanoutCi(Aig_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns CI index with the largest number of fanouts.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Llb_ManMaxFanoutCi( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj; 
    int i, WeightMax = -ABC_INFINITY, iInput = -1;
    Aig_ManForEachCi( pAig, pObj, i )
        if ( WeightMax < Aig_ObjRefs(pObj) )
        {
            WeightMax = Aig_ObjRefs(pObj);
            iInput = i;
        }
    assert( iInput >= 0 );
    return iInput;
}